

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testinter.cpp
# Opt level: O0

void popupnewone_proc(Am_Object *param_1)

{
  ushort uVar1;
  Am_Object *pAVar2;
  Am_Wrapper *pAVar3;
  ostream *poVar4;
  void *pvVar5;
  Am_Object local_48;
  undefined1 local_40 [8];
  Am_Value v;
  Am_Object local_20;
  Am_Object local_18;
  Am_Object new_pop;
  Am_Object *param_0_local;
  
  new_pop.data = (Am_Object_Data *)param_1;
  Am_Object::Create((char *)&local_20);
  uVar1 = Am_Object::Set((ushort)&local_20,100,(ulong)(window_count * 10 + 100));
  uVar1 = Am_Object::Set(uVar1,0x65,(ulong)(window_count * 10 + 100));
  pAVar2 = (Am_Object *)Am_Object::Set(uVar1,true,0);
  Am_Object::Am_Object(&local_18,pAVar2);
  Am_Object::~Am_Object(&local_20);
  if (window_count % 4 == 1) {
    pAVar3 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Yellow);
    Am_Object::Set((ushort)&local_18,(Am_Wrapper *)0x6a,(ulong)pAVar3);
  }
  else if (window_count % 4 == 2) {
    pAVar3 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Blue);
    Am_Object::Set((ushort)&local_18,(Am_Wrapper *)0x6a,(ulong)pAVar3);
  }
  else if (window_count % 4 == 3) {
    pAVar3 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Green);
    Am_Object::Set((ushort)&local_18,(Am_Wrapper *)0x6a,(ulong)pAVar3);
  }
  window_count = window_count + 1;
  poVar4 = std::operator<<((ostream *)&std::cout,"Popping up window ");
  pvVar5 = (void *)operator<<(poVar4,(Am_Object *)&local_18);
  pvVar5 = (void *)std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar5,std::flush<char,std::char_traits<char>>);
  Am_Value::Am_Value((Am_Value *)local_40);
  Am_Object::Am_Object(&local_48,(Am_Object *)&local_18);
  Am_Pop_Up_Window_And_Wait((Am_Object *)&local_48,(Am_Value *)local_40,false);
  Am_Object::~Am_Object(&local_48);
  poVar4 = std::operator<<((ostream *)&std::cout,"Popup ");
  poVar4 = (ostream *)operator<<(poVar4,(Am_Object *)&local_18);
  poVar4 = std::operator<<(poVar4," returned ");
  pvVar5 = (void *)operator<<(poVar4,(Am_Value *)local_40);
  pvVar5 = (void *)std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar5,std::flush<char,std::char_traits<char>>);
  Am_Value::~Am_Value((Am_Value *)local_40);
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, popupnewone, (Am_Object /*self*/))
{
  Am_Object new_pop = pop_up_window.Create()
                          .Set(Am_LEFT, 100 + window_count * 10)
                          .Set(Am_TOP, 100 + window_count * 10)
                          .Set(Am_VISIBLE, false);
  if (window_count % 4 == 1)
    new_pop.Set(Am_FILL_STYLE, Am_Yellow);
  else if (window_count % 4 == 2)
    new_pop.Set(Am_FILL_STYLE, Am_Blue);
  else if (window_count % 4 == 3)
    new_pop.Set(Am_FILL_STYLE, Am_Green);
  window_count++;
  cout << "Popping up window " << new_pop << endl << flush;
  Am_Value v;
  Am_Pop_Up_Window_And_Wait(new_pop, v, false);
  cout << "Popup " << new_pop << " returned " << v << endl << flush;
}